

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

Address * cfd::core::Address::GetPegoutAddress
                    (Address *__return_storage_ptr__,NetType_conflict type,Script *locking_script,
                    vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    *network_parameters)

{
  bool bVar1;
  size_type sVar2;
  CfdException *pCVar3;
  reference pvVar4;
  allocator local_199;
  string local_198;
  ByteData local_178;
  undefined1 local_160 [8];
  ByteData160 hash_3;
  undefined1 local_130 [8];
  ByteData160 hash_2;
  ByteData hash_1;
  undefined1 local_f8 [8];
  ByteData hash;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  undefined1 local_b0 [8];
  Script pegout_locking_script;
  string local_70;
  undefined1 local_40 [8];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> list;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  Script *locking_script_local;
  NetType_conflict type_local;
  
  list.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)network_parameters;
  Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)local_40
             ,locking_script);
  bVar1 = Script::IsPegoutScript(locking_script);
  if ((bVar1) &&
     (sVar2 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              size((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   local_40), 2 < sVar2)) {
    pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)local_40,2);
    ScriptElement::GetBinaryData
              ((ByteData *)
               &items.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
    Script::Script((Script *)local_b0,
                   (ByteData *)
                   &items.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)
                        &items.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Script::GetElementList
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(Script *)local_b0);
    bVar1 = Script::IsP2wpkhScript((Script *)local_b0);
    if (bVar1) {
      pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           *)&hash.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
      ScriptElement::GetBinaryData((ByteData *)local_f8,pvVar4);
      Address(__return_storage_ptr__,type,kVersion0,(ByteData *)local_f8,
              (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )list.
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ByteData::~ByteData((ByteData *)local_f8);
    }
    else {
      bVar1 = Script::IsTaprootScript((Script *)local_b0);
      if (bVar1) {
        pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               *)&hash.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,1);
        ScriptElement::GetBinaryData
                  ((ByteData *)
                   &hash_2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
        Address(__return_storage_ptr__,type,kVersion1,
                (ByteData *)
                &hash_2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)list.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ByteData::~ByteData((ByteData *)
                            &hash_2.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        bVar1 = Script::IsP2pkhScript((Script *)local_b0);
        if (bVar1) {
          pvVar4 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               *)&hash.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,2);
          ScriptElement::GetBinaryData
                    ((ByteData *)
                     &hash_3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
          ByteData160::ByteData160
                    ((ByteData160 *)local_130,
                     (ByteData *)
                     &hash_3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ByteData::~ByteData((ByteData *)
                              &hash_3.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          Address(__return_storage_ptr__,type,kP2pkhAddress,(ByteData160 *)local_130,
                  (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)list.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ByteData160::~ByteData160((ByteData160 *)local_130);
        }
        else {
          bVar1 = Script::IsP2shScript((Script *)local_b0);
          if (!bVar1) {
            pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_198,
                       "Invalid pegout script. This script is unsupported by pegout address.",
                       &local_199);
            CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_198);
            __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
          }
          pvVar4 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               *)&hash.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,1);
          ScriptElement::GetBinaryData(&local_178,pvVar4);
          ByteData160::ByteData160((ByteData160 *)local_160,&local_178);
          ByteData::~ByteData(&local_178);
          Address(__return_storage_ptr__,type,kP2shAddress,(ByteData160 *)local_160,
                  (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)list.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ByteData160::~ByteData160((ByteData160 *)local_160);
        }
      }
    }
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    Script::~Script((Script *)local_b0);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_40);
    return __return_storage_ptr__;
  }
  pegout_locking_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_70,"Invalid pegout script. This script have not a pegout address.",
             (allocator *)
             ((long)&pegout_locking_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_70);
  pegout_locking_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Address Address::GetPegoutAddress(
    NetType type, const Script& locking_script,
    const std::vector<AddressFormatData>& network_parameters) {
  auto list = locking_script.GetElementList();
  if ((!locking_script.IsPegoutScript()) || (list.size() <= 2)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid pegout script. This script have not a pegout address.");
  }

  Script pegout_locking_script = Script(list[2].GetBinaryData());
  auto items = pegout_locking_script.GetElementList();
  if (pegout_locking_script.IsP2wpkhScript()) {
    ByteData hash(items[1].GetBinaryData());
    return Address(type, WitnessVersion::kVersion0, hash, network_parameters);
  } else if (pegout_locking_script.IsTaprootScript()) {
    ByteData hash(items[1].GetBinaryData());
    return Address(type, WitnessVersion::kVersion1, hash, network_parameters);
  } else if (pegout_locking_script.IsP2pkhScript()) {
    ByteData160 hash(items[2].GetBinaryData());
    return Address(type, AddressType::kP2pkhAddress, hash, network_parameters);
  } else if (pegout_locking_script.IsP2shScript()) {
    ByteData160 hash(items[1].GetBinaryData());
    return Address(type, AddressType::kP2shAddress, hash, network_parameters);
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid pegout script. This script is unsupported by pegout "
        "address.");
  }
}